

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_is_hdr_from_file(FILE *f)

{
  int iVar1;
  stbi__context s;
  stbi__context local_e0;
  
  stbi__start_file(&local_e0,f);
  iVar1 = stbi__hdr_test(&local_e0);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_file(&s,f);
   return stbi__hdr_test(&s);
   #else
   STBI_NOTUSED(f);
   return 0;
   #endif
}